

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddNestedExtensions<google::protobuf::DescriptorProto>
          (DescriptorIndex *this,string_view filename,DescriptorProto *message_type)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  bool bVar1;
  bool bVar2;
  void **ppvVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  
  this_00 = &(message_type->field_0)._impl_.nested_type_;
  ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar4 = RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00);
  do {
    if (ppvVar3 == cVar4.it_) {
      this_01 = &(message_type->field_0)._impl_.extension_;
      ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
      cVar5 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_01);
      do {
        bVar1 = ppvVar3 == cVar5.it_;
        if (bVar1) {
          return bVar1;
        }
        bVar2 = AddExtension<google::protobuf::FieldDescriptorProto>
                          (this,filename,(FieldDescriptorProto *)*ppvVar3);
        ppvVar3 = ppvVar3 + 1;
      } while (bVar2);
      return bVar1;
    }
    bVar1 = AddNestedExtensions<google::protobuf::DescriptorProto>
                      (this,filename,(DescriptorProto *)*ppvVar3);
    ppvVar3 = ppvVar3 + 1;
  } while (bVar1);
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddNestedExtensions(
    absl::string_view filename, const DescProto& message_type) {
  for (const auto& nested_type : message_type.nested_type()) {
    if (!AddNestedExtensions(filename, nested_type)) return false;
  }
  for (const auto& extension : message_type.extension()) {
    if (!AddExtension(filename, extension)) return false;
  }
  return true;
}